

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdump.cc
# Opt level: O3

int BIO_hexdump(BIO *bio,uint8_t *data,size_t len,uint indent)

{
  long lVar1;
  uint uVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  int len_00;
  ulong uVar6;
  bool bVar7;
  char local_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char cStack_68;
  char local_67;
  char local_66;
  char local_65;
  undefined2 local_64;
  BIO *local_60;
  uint8_t local_58 [16];
  undefined8 local_48;
  ulong uStack_40;
  ulong local_38;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  local_38 = (ulong)indent;
  if (len != 0) {
    iVar4 = 0;
    uVar6 = 1;
    bVar7 = false;
    local_60 = (BIO *)bio;
    do {
      if (iVar4 == 0) {
        BIO_indent(local_60,(int)local_38,-1);
        local_6c = "0123456789abcdef"[uStack_40 >> 0x1c & 0xf];
        cStack_6b = "0123456789abcdef"[(uint)(uStack_40 >> 0x18) & 0xf];
        cStack_6a = "0123456789abcdef"[(uint)(uStack_40 >> 0x14) & 0xf];
        cStack_69 = "0123456789abcdef"[(uint)(uStack_40 >> 0x10) & 0xf];
        cStack_68 = "0123456789abcdef"[(uint)(uStack_40 >> 0xc) & 0xf];
        local_67 = "0123456789abcdef"[(uint)(uStack_40 >> 8) & 0xf];
        local_66 = "0123456789abcdef"[(uint)(uStack_40 >> 4) & 0xf];
        local_65 = "0123456789abcdef"[(uint)uStack_40 & 0xf];
        local_64 = 0x2020;
        iVar4 = BIO_write(local_60,&local_6c,10);
        if (iVar4 < 0) break;
        iVar4 = local_48._4_4_;
      }
      local_6c = "0123456789abcdef"[data[uVar6 - 1] >> 4];
      cStack_6b = "0123456789abcdef"[data[uVar6 - 1] & 0xf];
      cStack_6a = 0x20;
      if (iVar4 == 0xf) {
        cStack_69 = ' ';
        cStack_68 = '|';
        len_00 = 5;
      }
      else {
        len_00 = 3;
        if (iVar4 == 7) {
          cStack_69 = ' ';
          len_00 = 4;
        }
      }
      iVar4 = BIO_write(local_60,&local_6c,len_00);
      if (iVar4 < 0) break;
      uVar3 = data[uVar6 - 1];
      if ((byte)(data[uVar6 - 1] + 0x81) < 0xa1) {
        uVar3 = '.';
      }
      local_58[local_48 >> 0x20] = uVar3;
      iVar4 = local_48._4_4_ + 1;
      local_48 = CONCAT44(iVar4,(undefined4)local_48);
      uStack_40 = uStack_40 + 1;
      if (iVar4 == 0x10) {
        local_48 = CONCAT62(local_48._2_6_,0xa7c);
        iVar4 = BIO_write(local_60,local_58,0x12);
        if (iVar4 < 0) break;
        local_48 = local_48 & 0xffffffff;
        iVar4 = 0;
      }
      bVar7 = len <= uVar6;
      lVar1 = uVar6 + 1;
      uVar6 = uVar6 + 1;
    } while (lVar1 - len != 1);
    if (!bVar7) {
      return 0;
    }
    uVar2 = local_48._4_4_;
    uVar6 = (ulong)local_48._4_4_;
    if (uVar6 != 0) {
      local_6c = ' ';
      cStack_6b = 0x20;
      cStack_6a = 0x20;
      cStack_69 = 0x20;
      cStack_68 = 0x7c;
      if (local_48._4_4_ < 0x10) {
        uVar5 = local_48._4_4_;
        do {
          iVar4 = (uint)(uVar5 == 0xf) * 2 + 3;
          if (uVar5 == 7) {
            iVar4 = 4;
          }
          iVar4 = BIO_write(local_60,&local_6c,iVar4);
          if (iVar4 < 0) {
            return 0;
          }
          uVar5 = local_48._4_4_ + 1;
          local_48 = CONCAT44(uVar5,(undefined4)local_48);
        } while (uVar5 < 0x10);
      }
      local_58[uVar6] = '|';
      local_58[uVar2 + 1] = '\n';
      iVar4 = BIO_write(local_60,local_58,uVar2 + 2);
      if (iVar4 < 0) {
        return 0;
      }
      return 1;
    }
  }
  return 1;
}

Assistant:

int BIO_hexdump(BIO *bio, const uint8_t *data, size_t len, unsigned indent) {
  struct hexdump_ctx ctx;
  OPENSSL_memset(&ctx, 0, sizeof(ctx));
  ctx.bio = bio;
  ctx.indent = indent;

  if (!hexdump_write(&ctx, data, len) || !finish(&ctx)) {
    return 0;
  }

  return 1;
}